

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

bool check_user_password(string *user_password,EncryptionData *data)

{
  int iVar1;
  EncryptionData *data_local;
  string *user_password_local;
  
  iVar1 = QPDF::EncryptionData::getV(data);
  if (iVar1 < 5) {
    user_password_local._7_1_ = check_user_password_V4(user_password,data);
  }
  else {
    user_password_local._7_1_ = check_user_password_V5(user_password,data);
  }
  return user_password_local._7_1_;
}

Assistant:

static bool
check_user_password(std::string const& user_password, QPDF::EncryptionData const& data)
{
    if (data.getV() < 5) {
        return check_user_password_V4(user_password, data);
    } else {
        return check_user_password_V5(user_password, data);
    }
}